

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O1

bool __thiscall re2::BitState::TrySearch(BitState *this,int id0,char *p0)

{
  int iVar1;
  Job *pJVar2;
  StringPiece *pSVar3;
  char **ppcVar4;
  undefined8 uVar5;
  byte bVar6;
  bool bVar7;
  uint uVar8;
  uint32 uVar9;
  ostream *this_00;
  ulong uVar10;
  char cVar11;
  uint uVar12;
  byte *pbVar13;
  byte bVar14;
  uint uVar15;
  long lVar16;
  byte *p;
  Inst *this_01;
  byte *p_00;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  uint local_1d8;
  LogMessage local_1b0;
  
  p = (byte *)((this->text_).ptr_ + (this->text_).length_);
  this->njob_ = 0;
  bVar7 = false;
  Push(this,id0,p0,0);
  bVar14 = 0;
  local_1d8 = (uint)&this->context_;
LAB_0011ecb8:
  bVar6 = bVar14;
  if (this->njob_ < 1) {
LAB_0011f1c0:
    local_1d8._0_1_ = bVar6;
    return (bool)((byte)local_1d8 & 1);
  }
  uVar8 = this->njob_ - 1;
  this->njob_ = uVar8;
  pJVar2 = this->job_;
  iVar17 = pJVar2[uVar8].id;
  iVar1 = pJVar2[uVar8].arg;
  p_00 = (byte *)pJVar2[uVar8].p;
  uVar18 = (ulong)iVar17;
  this_01 = this->prog_->inst_ + uVar18;
  uVar8 = this_01->out_opcode_;
  uVar15 = uVar8 & 7;
  cVar11 = '\x02';
  switch(uVar15) {
  case 1:
    goto switchD_0011ed04_caseD_1;
  case 2:
    goto switchD_0011ed04_caseD_2;
  case 3:
    goto switchD_0011ed04_caseD_3;
  case 4:
    goto switchD_0011ed04_caseD_4;
  case 5:
    goto switchD_0011ed04_caseD_5;
  case 6:
    goto switchD_0011ed04_caseD_6;
  case 7:
    goto switchD_0011ed04_caseD_7;
  }
switchD_0011ed04_caseD_0:
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/bitstate.cc",0xb6
             ,3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b0.str_,"Unexpected opcode: ",0x13);
  this_00 = (ostream *)std::ostream::operator<<((ostream *)&local_1b0.str_,this_01->out_opcode_ & 7)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(this_00," arg ",5);
  std::ostream::operator<<((ostream *)this_00,iVar1);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  cVar11 = '\x01';
  local_1d8 = 0;
switchD_0011ed04_caseD_7:
  iVar17 = (int)uVar18;
  if (cVar11 == '\x04') {
    cVar11 = '\x02';
    if (((this->prog_->inst_[iVar17].out_opcode_ & 8) == 0) && (!bVar7)) {
      iVar17 = iVar17 + 1;
      goto LAB_0011edb7;
    }
LAB_0011f1ad:
    bVar6 = (byte)local_1d8;
    if (cVar11 != '\x02') goto LAB_0011f1c0;
    goto LAB_0011ecb8;
  }
  if (cVar11 != '\x05') goto LAB_0011f1ad;
LAB_0011edb7:
  uVar18 = (ulong)iVar17;
  pbVar13 = p_00 + (((long)(this->text_).length_ + 1) * uVar18 - (long)(this->text_).ptr_);
  uVar8 = this->visited_[(ulong)pbVar13 >> 5];
  if ((uVar8 >> ((uint)pbVar13 & 0x1f) & 1) != 0) {
    cVar11 = '\x02';
    goto LAB_0011f1ad;
  }
  this->visited_[(ulong)pbVar13 >> 5] = 1 << ((byte)pbVar13 & 0x1f) | uVar8;
  this_01 = this->prog_->inst_ + uVar18;
  uVar8 = this_01->out_opcode_;
  uVar15 = uVar8 & 7;
  cVar11 = '\x02';
  switch(uVar15) {
  case 0:
    goto switchD_0011ed04_caseD_0;
  case 1:
switchD_0011ed04_caseD_1:
    cVar11 = '\x02';
    if (iVar1 == 1) {
      bVar7 = false;
      goto switchD_0011ed04_caseD_7;
    }
    if (iVar1 == 0) {
      Push(this,(int)uVar18,(char *)p_00,1);
      bVar7 = Prog::Inst::greedy(this_01,this->prog_);
      if (bVar7) {
        if (((this_01->out_opcode_ & 6) != 0) ||
           (Push(this,(this_01->field_1).cap_,(char *)p_00,0), (this_01->out_opcode_ & 6) != 0)) {
          __assert_fail("opcode() == kInstAlt || opcode() == kInstAltMatch",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h"
                        ,0x6d,"int re2::Prog::Inst::out1()");
        }
        uVar18 = (ulong)(this_01->field_1).out1_;
        cVar11 = '\x05';
        bVar7 = true;
        p_00 = p;
      }
      else {
        Push(this,this_01->out_opcode_ >> 4,(char *)p,0);
        uVar18 = (ulong)(this_01->out_opcode_ >> 4);
        cVar11 = '\x05';
        bVar7 = true;
      }
      goto switchD_0011ed04_caseD_7;
    }
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/bitstate.cc",
               0xd4,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"Bad arg in kInstAltMatch: ",0x1a);
    std::ostream::operator<<((ostream *)&local_1b0.str_,iVar1);
    break;
  case 2:
switchD_0011ed04_caseD_2:
    uVar12 = 0xffffffff;
    if (p_00 < p) {
      uVar12 = (uint)*p_00;
    }
    if (uVar15 != 2) {
      __assert_fail("(opcode()) == (kInstByteRange)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h",
                    0x7e,"bool re2::Prog::Inst::Matches(int)");
    }
    uVar15 = uVar12 | 0x20;
    if ((this_01->field_1).field_3.foldcase_ == '\0') {
      uVar15 = uVar12;
    }
    if (0x19 < uVar12 - 0x41) {
      uVar15 = uVar12;
    }
    cVar11 = '\x04';
    if (((int)(uint)(this_01->field_1).field_3.lo_ <= (int)uVar15) &&
       ((int)uVar15 <= (int)(uint)(this_01->field_1).field_3.hi_)) {
      if ((uVar8 & 8) == 0) {
        Push(this,(int)uVar18 + 1,(char *)p_00,0);
      }
      uVar18 = (ulong)(this_01->out_opcode_ >> 4);
      cVar11 = '\x05';
      p_00 = p_00 + 1;
    }
    goto switchD_0011ed04_caseD_7;
  case 3:
switchD_0011ed04_caseD_3:
    if (iVar1 == 1) {
      if (uVar15 != 3) {
LAB_0011f1f6:
        __assert_fail("(opcode()) == (kInstCapture)",
                      "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h",
                      0x6e,"int re2::Prog::Inst::cap()");
      }
      this->cap_[(this_01->field_1).cap_] = (char *)p_00;
      cVar11 = '\x02';
      goto switchD_0011ed04_caseD_7;
    }
    if (iVar1 == 0) {
      if ((uVar8 & 8) == 0) {
        Push(this,(int)uVar18 + 1,(char *)p_00,0);
      }
      if ((this_01->out_opcode_ & 7) != 3) goto LAB_0011f1f6;
      iVar17 = (this_01->field_1).cap_;
      if ((-1 < (long)iVar17) && (iVar17 < this->ncap_)) {
        Push(this,(int)uVar18,this->cap_[iVar17],1);
        if ((this_01->out_opcode_ & 7) != 3) goto LAB_0011f1f6;
        this->cap_[(this_01->field_1).cap_] = (char *)p_00;
      }
      goto LAB_0011f196;
    }
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/bitstate.cc",
               0xfa,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,"Bad arg in kInstCapture: ",0x19);
    std::ostream::operator<<((ostream *)&local_1b0.str_,iVar1);
    break;
  case 4:
switchD_0011ed04_caseD_4:
    iVar17 = (int)uVar18;
    uVar8 = (this_01->field_1).out1_;
    uVar9 = Prog::EmptyFlags(&this->context_,(char *)p_00);
    cVar11 = '\x04';
    if ((uVar8 & ~uVar9) == 0) {
      if ((this_01->out_opcode_ & 8) == 0) {
LAB_0011f183:
        Push(this,iVar17 + 1,(char *)p_00,0);
      }
      goto LAB_0011f196;
    }
    goto switchD_0011ed04_caseD_7;
  case 5:
switchD_0011ed04_caseD_5:
    if ((this->endmatch_ != true) ||
       (cVar11 = '\x04', p_00 == (byte *)((this->text_).ptr_ + (this->text_).length_))) {
      uVar8 = this->nsubmatch_;
      uVar10 = (ulong)uVar8;
      cVar11 = '\x01';
      if (uVar8 != 0) {
        this->cap_[1] = (char *)p_00;
        pSVar3 = this->submatch_;
        if (pSVar3->ptr_ == (char *)0x0) {
          if (0 < (int)uVar8) goto LAB_0011f063;
        }
        else if ((this->longest_ == true) &&
                (pSVar3->ptr_ + pSVar3->length_ < p_00 && 0 < (int)uVar8)) {
LAB_0011f063:
          ppcVar4 = this->cap_;
          if ((int)uVar8 < 2) {
            uVar10 = 1;
          }
          lVar16 = 0;
          do {
            uVar5 = *(undefined8 *)((long)ppcVar4 + lVar16);
            iVar17 = *(int *)((long)ppcVar4 + lVar16 + 8);
            *(undefined8 *)((long)&pSVar3->ptr_ + lVar16) = uVar5;
            *(int *)((long)&pSVar3->length_ + lVar16) = iVar17 - (int)uVar5;
            lVar16 = lVar16 + 0x10;
          } while (uVar10 * 0x10 != lVar16);
        }
        if (this->longest_ == true) {
          bVar19 = p_00 == (byte *)((this->text_).ptr_ + (this->text_).length_);
          cVar11 = !bVar19 * '\x03' + '\x01';
          local_1d8 = (uint)(bVar19 | (byte)local_1d8);
          bVar14 = 1;
          goto switchD_0011ed04_caseD_7;
        }
        bVar14 = 1;
      }
      local_1d8 = 1;
    }
    goto switchD_0011ed04_caseD_7;
  case 6:
switchD_0011ed04_caseD_6:
    if ((uVar8 & 8) == 0) goto LAB_0011f183;
LAB_0011f196:
    uVar18 = (ulong)(this_01->out_opcode_ >> 4);
    cVar11 = '\x05';
  case 7:
    goto switchD_0011ed04_caseD_7;
  }
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  cVar11 = '\x02';
  goto switchD_0011ed04_caseD_7;
}

Assistant:

bool BitState::TrySearch(int id0, const char* p0) {
  bool matched = false;
  bool inaltmatch = false;
  const char* end = text_.end();
  njob_ = 0;
  Push(id0, p0, 0);
  while (njob_ > 0) {
    // Pop job off stack.
    --njob_;
    int id = job_[njob_].id;
    const char* p = job_[njob_].p;
    int arg = job_[njob_].arg;

    // Optimization: rather than push and pop,
    // code that is going to Push and continue
    // the loop simply updates ip, p, and arg
    // and jumps to CheckAndLoop.  We have to
    // do the ShouldVisit check that Push
    // would have, but we avoid the stack
    // manipulation.
    if (0) {
    Next:
      // If the Match of a non-greedy AltMatch failed,
      // we stop ourselves from trying the ByteRange,
      // which would steer us off the short circuit.
      if (prog_->inst(id)->last() || inaltmatch)
        continue;
      id++;

    CheckAndLoop:
      if (!ShouldVisit(id, p))
        continue;
    }

    // Visit ip, p.
    // VLOG(0) << "Job: " << ip->id() << " "
    //         << (p - text_.begin()) << " " << arg;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "Unexpected opcode: " << ip->opcode() << " arg " << arg;
        return false;

      case kInstFail:
        continue;

      case kInstAltMatch:
        switch (arg) {
          case 0:
            inaltmatch = true;
            Push(id, p, 1);  // come back when we're done

            // One opcode is ByteRange; the other leads to Match
            // (possibly via Nop or Capture).
            if (ip->greedy(prog_)) {
              // out1 is the match
              Push(ip->out1(), p, 0);
              id = ip->out1();
              p = end;
              goto CheckAndLoop;
            }
            // out is the match - non-greedy
            Push(ip->out(), end, 0);
            id = ip->out();
            goto CheckAndLoop;

          case 1:
            inaltmatch = false;
            continue;
        }
        LOG(DFATAL) << "Bad arg in kInstAltMatch: " << arg;
        continue;

      case kInstByteRange: {
        int c = -1;
        if (p < end)
          c = *p & 0xFF;
        if (!ip->Matches(c))
          goto Next;

        if (!ip->last())
          Push(id+1, p, 0);  // try the next when we're done
        id = ip->out();
        p++;
        goto CheckAndLoop;
      }

      case kInstCapture:
        switch (arg) {
          case 0:
            if (!ip->last())
              Push(id+1, p, 0);  // try the next when we're done

            if (0 <= ip->cap() && ip->cap() < ncap_) {
              // Capture p to register, but save old value.
              Push(id, cap_[ip->cap()], 1);  // come back when we're done
              cap_[ip->cap()] = p;
            }

            // Continue on.
            id = ip->out();
            goto CheckAndLoop;

          case 1:
            // Finished ip->out(); restore the old value.
            cap_[ip->cap()] = p;
            continue;
        }
        LOG(DFATAL) << "Bad arg in kInstCapture: " << arg;
        continue;

      case kInstEmptyWidth:
        if (ip->empty() & ~Prog::EmptyFlags(context_, p))
          goto Next;

        if (!ip->last())
          Push(id+1, p, 0);  // try the next when we're done
        id = ip->out();
        goto CheckAndLoop;

      case kInstNop:
        if (!ip->last())
          Push(id+1, p, 0);  // try the next when we're done
        id = ip->out();
        goto CheckAndLoop;

      case kInstMatch: {
        if (endmatch_ && p != text_.end())
          goto Next;

        // VLOG(0) << "Found match.";
        // We found a match.  If the caller doesn't care
        // where the match is, no point going further.
        if (nsubmatch_ == 0)
          return true;

        // Record best match so far.
        // Only need to check end point, because this entire
        // call is only considering one start position.
        matched = true;
        cap_[1] = p;
        if (submatch_[0].data() == NULL ||
            (longest_ && p > submatch_[0].end())) {
          for (int i = 0; i < nsubmatch_; i++)
            submatch_[i].set(cap_[2*i],
                             static_cast<int>(cap_[2*i+1] - cap_[2*i]));
        }

        // If going for first match, we're done.
        if (!longest_)
          return true;

        // If we used the entire text, no longer match is possible.
        if (p == text_.end())
          return true;

        // Otherwise, continue on in hope of a longer match.
        goto Next;
      }
    }
  }
  return matched;
}